

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O0

DdNode * cuddAddConstrainRecur(DdManager *dd,DdNode *f,DdNode *c)

{
  DdManager *pDVar1;
  DdManager *local_88;
  DdHalfWord local_7c;
  int index;
  uint topc;
  uint topf;
  DdNode *zero;
  DdNode *one;
  DdNode *r;
  DdNode *e;
  DdNode *t;
  DdNode *Cnv;
  DdNode *Cv;
  DdNode *Fnv;
  DdNode *Fv;
  DdNode *c_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  pDVar1 = (DdManager *)dd->one;
  dd_local = (DdManager *)f;
  if (((((DdManager *)c != pDVar1) &&
       (dd_local = (DdManager *)dd->zero, (DdManager *)c != (DdManager *)dd->zero)) &&
      (dd_local = (DdManager *)f, *(int *)((ulong)f & 0xfffffffffffffffe) != 0x7fffffff)) &&
     ((dd_local = pDVar1, f != c &&
      (dd_local = (DdManager *)cuddCacheLookup2(dd,Cudd_addConstrain,f,c),
      dd_local == (DdManager *)0x0)))) {
    if ((uint)dd->perm[c->index] < (uint)dd->perm[f->index]) {
      local_7c = c->index;
      Cv = f;
      Fnv = f;
    }
    else {
      local_7c = f->index;
      Fnv = (f->type).kids.T;
      Cv = (f->type).kids.E;
    }
    t = c;
    Cnv = c;
    if ((uint)dd->perm[c->index] <= (uint)dd->perm[f->index]) {
      Cnv = (c->type).kids.T;
      t = (c->type).kids.E;
    }
    if (*(int *)((ulong)Cnv & 0xfffffffffffffffe) == 0x7fffffff) {
      if ((DdManager *)Cnv != pDVar1) {
        if ((DdManager *)t == pDVar1) {
          one = Cv;
        }
        else {
          one = cuddAddConstrainRecur(dd,Cv,t);
          if (one == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
        }
        return one;
      }
      e = Fnv;
    }
    else {
      e = cuddAddConstrainRecur(dd,Fnv,Cnv);
      if (e == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
    }
    *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + 1;
    if (*(int *)((ulong)t & 0xfffffffffffffffe) == 0x7fffffff) {
      if ((DdManager *)t != pDVar1) {
        *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + -1;
        return e;
      }
      r = Cv;
    }
    else {
      r = cuddAddConstrainRecur(dd,Cv,t);
      if (r == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,e);
        return (DdNode *)0x0;
      }
    }
    *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + 1;
    if (e == r) {
      local_88 = (DdManager *)e;
    }
    else {
      local_88 = (DdManager *)cuddUniqueInter(dd,local_7c,e,r);
    }
    if (local_88 == (DdManager *)0x0) {
      Cudd_RecursiveDeref(dd,r);
      Cudd_RecursiveDeref(dd,e);
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + -1;
      *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + -1;
      cuddCacheInsert2(dd,Cudd_addConstrain,f,c,&local_88->sentinel);
      dd_local = local_88;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddAddConstrainRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * c)
{
    DdNode       *Fv, *Fnv, *Cv, *Cnv, *t, *e, *r;
    DdNode       *one, *zero;
    unsigned int topf, topc;
    int          index;

    statLine(dd);
    one = DD_ONE(dd);
    zero = DD_ZERO(dd);

    /* Trivial cases. */
    if (c == one)               return(f);
    if (c == zero)              return(zero);
    if (Cudd_IsConstant(f))     return(f);
    if (f == c)                 return(one);

    /* Now f and c are non-constant. */

    /* Check the cache. */
    r = cuddCacheLookup2(dd, Cudd_addConstrain, f, c);
    if (r != NULL) {
        return(r);
    }
    
    /* Recursive step. */
    topf = dd->perm[f->index];
    topc = dd->perm[c->index];
    if (topf <= topc) {
        index = f->index;
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        index = c->index;
        Fv = Fnv = f;
    }
    if (topc <= topf) {
        Cv = cuddT(c); Cnv = cuddE(c);
    } else {
        Cv = Cnv = c;
    }

    if (!Cudd_IsConstant(Cv)) {
        t = cuddAddConstrainRecur(dd, Fv, Cv);
        if (t == NULL)
            return(NULL);
    } else if (Cv == one) {
        t = Fv;
    } else {            /* Cv == zero: return Fnv @ Cnv */
        if (Cnv == one) {
            r = Fnv;
        } else {
            r = cuddAddConstrainRecur(dd, Fnv, Cnv);
            if (r == NULL)
                return(NULL);
        }
        return(r);
    }
    cuddRef(t);

    if (!Cudd_IsConstant(Cnv)) {
        e = cuddAddConstrainRecur(dd, Fnv, Cnv);
        if (e == NULL) {
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
    } else if (Cnv == one) {
        e = Fnv;
    } else {            /* Cnv == zero: return Fv @ Cv previously computed */
        cuddDeref(t);
        return(t);
    }
    cuddRef(e);

    r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd, e);
        Cudd_RecursiveDeref(dd, t);
        return(NULL);
    }
    cuddDeref(t);
    cuddDeref(e);

    cuddCacheInsert2(dd, Cudd_addConstrain, f, c, r);
    return(r);

}